

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.h
# Opt level: O0

bool __thiscall
wallet::DatabaseBatch::
Write<std::pair<std::__cxx11::string,std::pair<std::__cxx11::string,std::__cxx11::string>>,std::__cxx11::string>
          (DatabaseBatch *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *key,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          bool fOverwrite)

{
  byte bVar1;
  byte in_CL;
  long *in_RDI;
  long in_FS_OFFSET;
  DataStream ssValue;
  DataStream ssKey;
  DataStream *in_stack_ffffffffffffff58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  DataStream::DataStream(in_stack_ffffffffffffff58);
  DataStream::reserve(in_stack_ffffffffffffff58,0x17a52c1);
  DataStream::operator<<
            ((DataStream *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60);
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  DataStream::DataStream(in_stack_ffffffffffffff58);
  DataStream::reserve(in_stack_ffffffffffffff58,0x17a5302);
  DataStream::operator<<
            ((DataStream *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
             &in_stack_ffffffffffffff60->first);
  bVar1 = (**(code **)(*in_RDI + 8))(in_RDI,&local_28,&local_48,in_CL & 1);
  DataStream::~DataStream(in_stack_ffffffffffffff58);
  DataStream::~DataStream(in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool Write(const K& key, const T& value, bool fOverwrite = true)
    {
        DataStream ssKey{};
        ssKey.reserve(1000);
        ssKey << key;

        DataStream ssValue{};
        ssValue.reserve(10000);
        ssValue << value;

        return WriteKey(std::move(ssKey), std::move(ssValue), fOverwrite);
    }